

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gwham.hpp
# Opt level: O3

void __thiscall
WHAM<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>
::printfree(WHAM<std::shared_ptr<Ensemble>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_double>,_gnarray<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_double>_>
            *this)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  
  printf("#%10s%30s\n","State","DimensionlessFreeEnergy");
  if ((this->expf).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->expf).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar5 = 0;
    uVar6 = 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"#",1);
      pbVar4 = fcout.stream;
      fcout.w = 10;
      lVar1 = *(long *)fcout.stream;
      *(undefined8 *)(fcout.stream + *(long *)(lVar1 + -0x18) + 0x10) = 10;
      *(ulong *)(pbVar4 + *(long *)(lVar1 + -0x18) + 8) = (ulong)fcout.prec;
      std::ostream::_M_insert<unsigned_long>((ulong)pbVar4);
      fcout.w = 0x1e;
      fcout.prec = 0xf;
      dVar7 = log((this->expf).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar5]);
      pbVar4 = fcout.stream;
      lVar1 = *(long *)fcout.stream;
      *(ulong *)(fcout.stream + *(long *)(lVar1 + -0x18) + 0x10) = fcout._8_8_ & 0xffffffff;
      *(ulong *)(pbVar4 + *(long *)(lVar1 + -0x18) + 8) = (ulong)fcout._8_8_ >> 0x20;
      std::ostream::_M_insert<double>(dVar7);
      cVar3 = (char)fcout.stream;
      std::ios::widen((char)*(undefined8 *)(*(long *)fcout.stream + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      bVar2 = uVar6 < (ulong)((long)(this->expf).super__Vector_base<double,_std::allocator<double>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->expf).super__Vector_base<double,_std::allocator<double>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3);
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar2);
  }
  return;
}

Assistant:

void WHAM<PENSEMBLE,HISTOGRAM,NARRAY>::printfree() const {
  printf("#%10s%30s\n","State","DimensionlessFreeEnergy");
  for(uint i = 0; i < expf.size(); ++i) {
    cout << "#";
    fcout.width(10);
    fcout << i;
    fcout.width(30);
    fcout.precision(15);
    fcout << log(expf[i]) << endl;
  }
}